

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8_range.c
# Opt level: O3

int utf8_range_IsValid(char *data,size_t len)

{
  ulong *puVar1;
  long lVar2;
  size_t sVar3;
  ulong *end;
  ulong *puVar4;
  ulong *data_00;
  
  if (len == 0) {
    return 1;
  }
  end = (ulong *)(data + len);
  puVar4 = (ulong *)data;
  if (7 < (long)len) {
    do {
      if ((*puVar4 & 0x8080808080808080) != 0) break;
      puVar4 = puVar4 + 1;
      data = data + 8;
      len = len - 8;
    } while (7 < (long)len);
  }
  data_00 = puVar4;
  if (puVar4 < end) {
    lVar2 = (long)end - (long)data;
    puVar1 = (ulong *)((long)puVar4 + lVar2);
    do {
      data_00 = puVar4;
      if ((char)*puVar4 < '\0') break;
      puVar4 = (ulong *)((long)puVar4 + 1);
      lVar2 = lVar2 + -1;
      data_00 = puVar1;
    } while (lVar2 != 0);
  }
  sVar3 = utf8_range_ValidateUTF8Naive((char *)data_00,(char *)end,0);
  return (int)(sVar3 != 0);
}

Assistant:

static FORCE_INLINE_ATTR inline size_t utf8_range_Validate(
    const char* data, size_t len, int return_position) {
  if (len == 0) return 1 - return_position;
  // Save buffer start address for later use
  const char* const data_original = data;
  const char* const end = data + len;
  data = utf8_range_SkipAscii(data, end);
  /* SIMD algorithm always outperforms the naive version for any data of
     length >=16.
   */
  if (end - data < 16) {
    return (return_position ? (data - data_original) : 0) +
           utf8_range_ValidateUTF8Naive(data, end, return_position);
  }
#if defined(__SSE4_1__) || (defined(__ARM_NEON) && defined(__ARM_64BIT_STATE))
  return utf8_range_ValidateUTF8Simd(
      data_original, data, end, return_position);
#else
  return (return_position ? (data - data_original) : 0) +
         utf8_range_ValidateUTF8Naive(data, end, return_position);
#endif
}